

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O1

void lzma_lzma_optimum_normal
               (lzma_coder_conflict9 *coder,lzma_mf *mf,uint32_t *back_res,uint32_t *len_res,
               uint32_t position)

{
  lzma_match *matches;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  uint8_t *puVar7;
  uint32_t (*pauVar8) [272];
  uint uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  ulong uVar13;
  sbyte sVar14;
  int iVar15;
  ulong uVar16;
  uint32_t *puVar17;
  short sVar18;
  lzma_lzma_state lVar19;
  lzma_lzma_state lVar20;
  uint uVar21;
  uint32_t price;
  uint uVar22;
  int iVar23;
  long lVar24;
  uint32_t uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint32_t (*pauVar30) [128];
  uint uVar31;
  undefined4 in_register_00000084;
  ulong uVar32;
  uint8_t *puVar33;
  uint uVar34;
  long lVar35;
  ulong uVar36;
  short *psVar37;
  uint uVar38;
  lzma_optimal *plVar39;
  uint32_t (*pauVar40) [64];
  uint uVar41;
  uint uVar42;
  ulong uVar43;
  uint32_t pos_prev;
  ulong uVar44;
  uint32_t model_index;
  ulong uVar45;
  bool bVar46;
  uint32_t reps [4];
  ulong local_1c0;
  ulong local_178;
  uint local_158 [3];
  uint32_t uStack_14c;
  uint *local_140;
  lzma_mf *local_138;
  lzma_optimal *local_130;
  uint local_128;
  uint32_t local_124;
  ulong local_120;
  ulong local_118;
  uint32_t *local_110;
  ulong local_108;
  ulong local_100;
  uint local_f8;
  int local_f4;
  probability (*local_f0) [16];
  uint32_t (*local_e8) [272];
  long local_e0;
  ulong local_d8;
  uint32_t *local_d0;
  probability (*local_c8) [16];
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  uint local_a4;
  undefined8 local_a0;
  ulong local_98;
  uint32_t *local_90;
  long local_88;
  ulong local_80;
  ulong local_78;
  uint32_t *local_70;
  ulong local_68;
  probability *local_60;
  uint32_t (*local_58) [128];
  uint32_t (*local_50) [64];
  long local_48;
  ulong local_40;
  uint32_t (*local_38) [272];
  
  local_a0 = CONCAT44(in_register_00000084,position);
  local_140 = len_res;
  uVar22 = coder->opts_current_index;
  uVar10 = mf->read_ahead;
  if (coder->opts_end_index == uVar22) {
    local_138 = mf;
    if (uVar10 == 0) {
      if (0x7f < coder->match_price_count) {
        pauVar30 = coder->distances_prices;
        puVar17 = coder->pos_slot_prices[0] + 0xe;
        lVar35 = 0;
        pauVar40 = coder->pos_slot_prices;
        do {
          if (coder->dist_table_size != 0) {
            uVar45 = 0;
            do {
              uVar25 = 0;
              uVar22 = (int)uVar45 + 0x40;
              do {
                uVar41 = uVar22 >> 1;
                uVar25 = uVar25 + lzma_rc_prices
                                  [(-(uVar22 & 1) & 0x7f0 ^
                                   (uint)*(ushort *)
                                          ((long)coder->pos_slot[lVar35] +
                                          (ulong)(uVar22 & 0xfffffffe))) >> 4];
                uVar22 = uVar41;
              } while (uVar41 != 1);
              coder->pos_slot_prices[lVar35][uVar45] = uVar25;
              uVar45 = uVar45 + 1;
            } while (uVar45 < coder->dist_table_size);
          }
          if (0xe < coder->dist_table_size) {
            uVar22 = 0x70;
            lVar24 = 0;
            do {
              puVar17[lVar24] = ((uVar22 & 0xfffffff0) + puVar17[lVar24]) - 0x50;
              uVar45 = lVar24 + 0xf;
              uVar22 = uVar22 + 8;
              lVar24 = lVar24 + 1;
            } while (uVar45 < coder->dist_table_size);
          }
          lVar24 = 0;
          do {
            (*pauVar30)[lVar24] = (*pauVar40)[lVar24];
            lVar24 = lVar24 + 1;
          } while (lVar24 != 4);
          lVar35 = lVar35 + 1;
          puVar17 = puVar17 + 0x40;
          pauVar30 = pauVar30 + 1;
          pauVar40 = pauVar40 + 1;
        } while (lVar35 != 4);
        puVar17 = coder->distances_prices[0] + 4;
        lVar35 = 4;
        do {
          bVar1 = ""[lVar35];
          iVar15 = (bVar1 >> 1) - 1;
          uVar41 = (bVar1 & 1 | 2) << ((byte)iVar15 & 0x1f);
          uVar26 = (int)lVar35 - uVar41;
          uVar22 = 1;
          iVar23 = 0;
          do {
            uVar9 = uVar26 & 1;
            uVar45 = (ulong)uVar22;
            uVar22 = uVar9 + uVar22 * 2;
            uVar26 = uVar26 >> 1;
            iVar23 = iVar23 + (uint)lzma_rc_prices
                                    [(-uVar9 & 0x7f0 ^
                                     (uint)*(ushort *)
                                            ((long)coder +
                                            uVar45 * 2 +
                                            ((ulong)uVar41 * 2 - (ulong)((uint)bVar1 + (uint)bVar1))
                                            + 0x70fa)) >> 4];
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
          lVar24 = 0;
          do {
            *(int *)((long)puVar17 + lVar24 * 2) =
                 *(int *)((long)coder->pos_slot_prices[0] + lVar24 + (ulong)bVar1 * 4) + iVar23;
            lVar24 = lVar24 + 0x100;
          } while (lVar24 != 0x400);
          lVar35 = lVar35 + 1;
          puVar17 = puVar17 + 1;
        } while (lVar35 != 0x80);
        coder->match_price_count = 0;
      }
      if (0xf < coder->align_price_count) {
        uVar45 = 0;
        do {
          uVar22 = 1;
          iVar15 = -4;
          uVar36 = uVar45 & 0xffffffff;
          uVar25 = 0;
          do {
            uVar41 = (uint)uVar36 & 1;
            uVar13 = (ulong)uVar22;
            uVar22 = uVar41 + uVar22 * 2;
            uVar36 = uVar36 >> 1;
            uVar25 = uVar25 + lzma_rc_prices
                              [(-uVar41 & 0x7f0 ^ (uint)coder->pos_align[uVar13]) >> 4];
            iVar15 = iVar15 + 1;
          } while (iVar15 != 0);
          coder->align_prices[uVar45] = uVar25;
          uVar45 = uVar45 + 1;
        } while (uVar45 != 0x10);
        coder->align_price_count = 0;
      }
    }
    uVar22 = mf->nice_len;
    if (uVar10 == 1) {
      uVar10 = coder->longest_match_length;
      local_124 = coder->matches_count;
    }
    else {
      if (uVar10 != 0) {
        __assert_fail("mf->read_ahead == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                      ,0x136,
                      "uint32_t helper1(lzma_coder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                     );
      }
      uVar10 = lzma_mf_find(mf,&local_124,coder->matches);
    }
    uVar45 = (ulong)mf->read_pos;
    uVar41 = (mf->write_pos - mf->read_pos) + 1;
    if (uVar41 < 2) {
      *back_res = 0xffffffff;
      *local_140 = 1;
      local_1c0 = 0xffffffff;
    }
    else {
      uVar26 = 0x111;
      if (uVar41 < 0x111) {
        uVar26 = uVar41;
      }
      puVar7 = mf->buffer;
      sVar18 = *(short *)(puVar7 + (uVar45 - 1));
      uVar36 = 3;
      if (3 < uVar26) {
        uVar36 = (ulong)uVar26;
      }
      uVar43 = 0;
      uVar13 = 0;
      do {
        if (sVar18 == *(short *)(puVar7 + (uVar45 - 2) + -(ulong)coder->reps[uVar43])) {
          uVar26 = 2;
          if (uVar41 != 2) {
            uVar32 = 2;
            do {
              uVar16 = uVar32;
              if (puVar7[uVar32 + (uVar45 - 1)] !=
                  puVar7[uVar32 + (uVar45 - coder->reps[uVar43]) + -2]) break;
              uVar32 = uVar32 + 1;
              uVar16 = uVar36;
            } while (uVar36 != uVar32);
            uVar26 = (uint)uVar16;
            mf = local_138;
          }
          local_158[uVar43] = uVar26;
          if (local_158[uVar13] < uVar26) {
            uVar13 = uVar43 & 0xffffffff;
          }
        }
        else {
          local_158[uVar43] = 0;
        }
        uVar43 = uVar43 + 1;
      } while (uVar43 != 4);
      uVar41 = local_158[uVar13];
      if (uVar41 < uVar22) {
        if (uVar10 < uVar22) {
          bVar1 = puVar7[uVar45 - 1];
          bVar3 = (puVar7 + (uVar45 - 1))[~(ulong)coder->reps[0]];
          if (((uVar41 < 2) && (uVar10 < 2)) && (bVar1 != bVar3)) {
            *back_res = 0xffffffff;
            *local_140 = 1;
            local_1c0 = 0xffffffff;
          }
          else {
            uVar13 = (ulong)coder->state;
            coder->opts[0].state = coder->state;
            uVar22 = coder->pos_mask & (uint)local_a0;
            uVar36 = (ulong)(coder->is_match[uVar13][uVar22] >> 4);
            bVar4 = lzma_rc_prices[uVar36];
            uVar25 = get_literal_price(coder,(uint)local_a0,(uint)puVar7[uVar45 - 2],6 < uVar13,
                                       (uint)bVar3,(uint)bVar1);
            coder->opts[1].price = uVar25 + bVar4;
            coder->opts[1].back_prev = 0xffffffff;
            coder->opts[1].prev_1_is_literal = false;
            bVar2 = lzma_rc_prices[uVar36 ^ 0x7f];
            uVar45 = (ulong)(coder->is_rep[uVar13] >> 4);
            iVar15 = (uint)lzma_rc_prices[uVar45 ^ 0x7f] + (uint)bVar2;
            if ((bVar1 == bVar3) &&
               (uVar26 = (uint)lzma_rc_prices[coder->is_rep0_long[uVar13][uVar22] >> 4] +
                         (uint)lzma_rc_prices[coder->is_rep0[uVar13] >> 4] + iVar15,
               uVar26 < uVar25 + bVar4)) {
              coder->opts[1].price = uVar26;
              coder->opts[1].back_prev = 0;
              coder->opts[1].prev_1_is_literal = false;
            }
            if (uVar41 < uVar10) {
              uVar41 = uVar10;
            }
            local_1c0 = (ulong)uVar41;
            mf = local_138;
            if (uVar41 < 2) {
              *back_res = coder->opts[1].back_prev;
              *local_140 = 1;
              local_1c0 = 0xffffffff;
            }
            else {
              coder->opts[1].pos_prev = 0;
              lVar35 = 0;
              do {
                coder->opts[0].backs[lVar35] = coder->reps[lVar35];
                lVar35 = lVar35 + 1;
              } while (lVar35 != 4);
              puVar17 = &coder->opts[local_1c0].price;
              uVar36 = local_1c0;
              do {
                *puVar17 = 0x40000000;
                uVar41 = (int)uVar36 - 1;
                uVar36 = (ulong)uVar41;
                puVar17 = puVar17 + -0xb;
              } while (1 < uVar41);
              lVar35 = 0;
              do {
                uVar41 = local_158[lVar35];
                if (1 < uVar41) {
                  uVar36 = (ulong)(coder->is_rep0[uVar13] >> 4);
                  if (lVar35 == 0) {
                    uVar26 = (uint)lzma_rc_prices[uVar36];
                    bVar1 = lzma_rc_prices[(ulong)(coder->is_rep0_long[uVar13][uVar22] >> 4) ^ 0x7f]
                    ;
LAB_0045c327:
                    iVar23 = bVar1 + uVar26;
                  }
                  else {
                    uVar43 = (ulong)(coder->is_rep1[uVar13] >> 4);
                    if (lVar35 != 1) {
                      uVar26 = (uint)lzma_rc_prices[uVar43 ^ 0x7f] +
                               (uint)lzma_rc_prices[uVar36 ^ 0x7f];
                      bVar1 = lzma_rc_prices
                              [(2 - (uint32_t)lVar35 & 0x7f0 ^ (uint)coder->is_rep2[uVar13]) >> 4];
                      goto LAB_0045c327;
                    }
                    iVar23 = (uint)lzma_rc_prices[uVar43] + (uint)lzma_rc_prices[uVar36 ^ 0x7f];
                  }
                  puVar17 = (coder->rep_len_encoder).prices[uVar22] + (uVar41 - 2);
                  do {
                    uVar26 = *puVar17 + iVar23 + iVar15;
                    if (uVar26 < coder->opts[uVar41].price) {
                      coder->opts[uVar41].price = uVar26;
                      coder->opts[uVar41].pos_prev = 0;
                      coder->opts[uVar41].back_prev = (uint32_t)lVar35;
                      coder->opts[uVar41].prev_1_is_literal = false;
                    }
                    uVar41 = uVar41 - 1;
                    puVar17 = puVar17 + -1;
                  } while (1 < uVar41);
                }
                lVar35 = lVar35 + 1;
              } while (lVar35 != 4);
              uVar36 = 2;
              if (1 < local_158[0]) {
                uVar36 = (ulong)(local_158[0] + 1);
              }
              if ((uint)uVar36 <= uVar10) {
                bVar1 = lzma_rc_prices[uVar45];
                uVar45 = 0xffffffff;
                do {
                  uVar45 = (ulong)((int)uVar45 + 1);
                } while (coder->matches[uVar45].len < (uint)uVar36);
                while( true ) {
                  uVar41 = coder->matches[uVar45].dist;
                  uVar26 = (uint)uVar36;
                  uVar9 = 3;
                  if (uVar26 < 6) {
                    uVar9 = uVar26 - 2;
                  }
                  if ((ulong)uVar41 < 0x80) {
                    uVar10 = coder->distances_prices[uVar9][uVar41];
                  }
                  else {
                    sVar14 = 0x1e;
                    if (-1 < (int)uVar41) {
                      sVar14 = 0x12;
                    }
                    iVar15 = 0x3c;
                    if (-1 < (int)uVar41) {
                      iVar15 = 0x24;
                    }
                    if (uVar41 < 0x80000) {
                      sVar14 = 6;
                    }
                    if (uVar41 < 0x80000) {
                      iVar15 = 0xc;
                    }
                    uVar10 = coder->align_prices[uVar41 & 0xf] +
                             coder->pos_slot_prices[uVar9][(uint)""[uVar41 >> sVar14] + iVar15];
                  }
                  uVar9 = uVar10 + (uint)bVar1 + (uint)bVar2 +
                          (coder->match_len_encoder).prices[uVar22][uVar26 - 2];
                  if (uVar9 < coder->opts[uVar36].price) {
                    coder->opts[uVar36].price = uVar9;
                    coder->opts[uVar36].pos_prev = 0;
                    coder->opts[uVar36].back_prev = uVar41 + 4;
                    coder->opts[uVar36].prev_1_is_literal = false;
                  }
                  uVar41 = coder->matches[uVar45].len;
                  uVar9 = (int)uVar45 + 1;
                  if ((uVar26 == uVar41) && (uVar9 == local_124)) break;
                  uVar13 = (ulong)uVar9;
                  if (uVar26 != uVar41) {
                    uVar13 = uVar45;
                  }
                  uVar36 = (ulong)(uVar26 + 1);
                  uVar45 = uVar13;
                }
              }
            }
          }
        }
        else {
          *back_res = coder->matches[local_124 - 1].dist + 4;
          *local_140 = uVar10;
          local_1c0 = 0xffffffff;
          uVar10 = uVar10 - 1;
          if (uVar10 != 0) {
            (*mf->skip)(mf,uVar10);
            mf->read_ahead = mf->read_ahead + uVar10;
          }
        }
      }
      else {
        *back_res = (uint32_t)uVar13;
        *local_140 = uVar41;
        local_1c0 = 0xffffffff;
        uVar10 = uVar41 - 1;
        if (uVar10 != 0) {
          (*mf->skip)(mf,uVar10);
          mf->read_ahead = mf->read_ahead + uVar10;
        }
      }
    }
    if ((uint)local_1c0 != 0xffffffff) {
      local_158[0] = (uint)*(undefined8 *)coder->reps;
      local_158[1] = (uint)((ulong)*(undefined8 *)coder->reps >> 0x20);
      local_158[2] = (uint)*(undefined8 *)(coder->reps + 2);
      uStack_14c = (uint32_t)((ulong)*(undefined8 *)(coder->reps + 2) >> 0x20);
      uVar45 = 1;
      if (1 < (uint)local_1c0) {
        local_90 = &coder->matches_count;
        matches = coder->matches;
        local_130 = coder->opts;
        local_f0 = coder->is_match;
        local_c8 = coder->is_rep0_long;
        local_e8 = (coder->rep_len_encoder).prices;
        local_38 = (coder->match_len_encoder).prices;
        local_50 = coder->pos_slot_prices;
        local_58 = coder->distances_prices;
        local_d0 = coder->opts[0].backs;
        local_70 = coder->opts[1].backs;
        local_110 = &coder->opts[1].price;
        local_178 = 0xffe;
        lVar35 = 0;
        uVar45 = 1;
        do {
          if (lVar35 == 0xfff) {
            __assert_fail("cur < OPTS",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                          ,0x38e,
                          "void lzma_lzma_optimum_normal(lzma_coder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                         );
          }
          uVar10 = lzma_mf_find(mf,local_90,matches);
          local_68 = (ulong)uVar10;
          coder->longest_match_length = uVar10;
          local_118 = (ulong)mf->nice_len;
          if (mf->nice_len <= uVar10) break;
          uVar36 = (ulong)mf->read_pos;
          local_f8 = (mf->write_pos - mf->read_pos) + 1;
          uVar10 = (uint32_t)uVar45;
          uVar22 = 0xfff - uVar10;
          if (local_f8 < 0xfff - uVar10) {
            uVar22 = local_f8;
          }
          plVar39 = local_130 + uVar45;
          uVar13 = (ulong)local_130[uVar45].pos_prev;
          if (local_130[uVar45].prev_1_is_literal == true) {
            uVar41 = local_130[uVar45].pos_prev - 1;
            uVar13 = (ulong)uVar41;
            if (plVar39->prev_2 == true) {
              if (plVar39->back_prev_2 < 4) {
                lVar19 = (uint)(STATE_SHORTREP_LIT < local_130[plVar39->pos_prev_2].state) * 3 +
                         STATE_LIT_LONGREP;
              }
              else {
                lVar19 = (uint)(STATE_SHORTREP_LIT < local_130[plVar39->pos_prev_2].state) * 3 +
                         STATE_LIT_MATCH;
              }
            }
            else {
              lVar19 = local_130[uVar41].state;
            }
            lVar20 = (lVar19 - STATE_SHORTREP_LIT) + (uint)(lVar19 < STATE_NONLIT_MATCH) * 3;
            if (lVar19 < STATE_MATCH_LIT) {
              lVar20 = STATE_LIT_LIT;
            }
          }
          else {
            lVar20 = local_130[uVar13].state;
          }
          puVar7 = mf->buffer;
          local_128 = *local_90;
          uVar41 = (uint)uVar13;
          local_88 = lVar35;
          if (uVar45 - 1 == uVar13) {
            if (plVar39->back_prev == 0) {
              lVar19 = (uint)(STATE_SHORTREP_LIT < lVar20) * 2 + STATE_LIT_SHORTREP;
            }
            else {
              lVar19 = (lVar20 - STATE_SHORTREP_LIT) + (uint)(lVar20 < STATE_NONLIT_MATCH) * 3;
              if (lVar20 < STATE_MATCH_LIT) {
                lVar19 = STATE_LIT_LIT;
              }
            }
          }
          else {
            if ((local_130[uVar45].prev_1_is_literal == false) || (plVar39->prev_2 != true)) {
              uVar26 = plVar39->back_prev;
              if (uVar26 < 4) goto LAB_0045c764;
              lVar19 = (uint)(STATE_SHORTREP_LIT < lVar20) * 3 + STATE_LIT_MATCH;
            }
            else {
              uVar41 = plVar39->pos_prev_2;
              uVar26 = plVar39->back_prev_2;
LAB_0045c764:
              lVar19 = (uint)(STATE_SHORTREP_LIT < lVar20) * 3 + STATE_LIT_LONGREP;
            }
            uVar13 = (ulong)uVar41;
            if (uVar26 < 4) {
              local_158[0] = local_130[uVar13].backs[uVar26];
              if (uVar26 == 0) {
                uVar43 = 1;
              }
              else {
                uVar43 = (ulong)(uVar26 + 1);
                memcpy(local_158 + 1,local_d0 + uVar13 * 0xb,uVar43 * 4 - 4);
              }
              puVar17 = local_d0;
              if ((uint)uVar43 < 4) {
                do {
                  local_158[uVar43] = puVar17[uVar13 * 0xb + uVar43];
                  uVar43 = uVar43 + 1;
                } while ((int)uVar43 != 4);
              }
            }
            else {
              local_158[0] = uVar26 - 4;
              uStack_14c = local_d0[uVar13 * 0xb + 2];
              local_158[1] = (uint)*(undefined8 *)(local_d0 + uVar13 * 0xb);
              local_158[2] = (uint)((ulong)*(undefined8 *)(local_d0 + uVar13 * 0xb) >> 0x20);
            }
          }
          puVar17 = local_70 + local_88 * 0xb;
          uVar26 = uVar10 + (int)local_a0;
          local_d8 = (ulong)uVar26;
          plVar39->state = lVar19;
          *puVar17 = local_158[0];
          *(ulong *)(puVar17 + 1) = CONCAT44(local_158[2],local_158[1]);
          puVar17[3] = uStack_14c;
          uVar25 = plVar39->price;
          bVar1 = puVar7[uVar36 - 1];
          local_108 = (ulong)local_158[0];
          bVar3 = puVar7[(uVar36 - local_108) + -2];
          uVar41 = coder->pos_mask;
          uVar43 = (ulong)(uVar41 & uVar26);
          uVar13 = (ulong)lVar19;
          uVar32 = (ulong)(local_f0[uVar13][uVar43] >> 4);
          bVar4 = lzma_rc_prices[uVar32];
          local_120 = uVar13;
          local_b0 = uVar36;
          uVar11 = get_literal_price(coder,uVar26,(uint)puVar7[uVar36 - 2],
                                     STATE_SHORTREP_LIT < lVar19,(uint)bVar3,(uint)bVar1);
          pauVar8 = local_e8;
          uVar26 = uVar11 + uVar25 + (uint)bVar4;
          local_98 = uVar45 + 1;
          bVar46 = uVar26 < local_130[local_98].price;
          if (bVar46) {
            local_130[local_98].price = uVar26;
            local_130[local_98].pos_prev = uVar10;
            local_130[local_98].back_prev = 0xffffffff;
            local_130[local_98].prev_1_is_literal = false;
          }
          local_f4 = uVar25 + lzma_rc_prices[uVar32 ^ 0x7f];
          uVar32 = (ulong)(coder->is_rep[local_120] >> 4);
          iVar15 = (uint)lzma_rc_prices[uVar32 ^ 0x7f] + local_f4;
          local_e0 = CONCAT44(local_e0._4_4_,iVar15);
          if ((bVar3 == bVar1) &&
             (((uVar45 <= local_130[local_98].pos_prev || (local_130[local_98].back_prev != 0)) &&
              (uVar9 = (uint)lzma_rc_prices[local_c8[uVar13][uVar43] >> 4] +
                       (uint)lzma_rc_prices[coder->is_rep0[local_120] >> 4] + iVar15,
              uVar9 <= local_130[local_98].price)))) {
            local_130[local_98].price = uVar9;
            local_130[local_98].pos_prev = uVar10;
            local_130[local_98].back_prev = 0;
            local_130[local_98].prev_1_is_literal = false;
            bVar46 = true;
          }
          uVar9 = (uint)local_178;
          if (1 < uVar22) {
            uVar34 = (uint)local_118;
            uVar31 = uVar34;
            if (uVar22 < uVar34) {
              uVar31 = uVar22;
            }
            local_100 = CONCAT44(local_100._4_4_,uVar31);
            local_c0 = (ulong)local_f8;
            local_78 = uVar32;
            uVar31 = (uint)local_120;
            if (bVar3 != bVar1 && !bVar46) {
              uVar34 = uVar34 + 1;
              uVar38 = uVar22;
              if (uVar34 < uVar22) {
                uVar38 = uVar34;
              }
              uVar45 = 1;
              if (1 < uVar38) {
                uVar32 = local_c0;
                if (local_178 < local_c0) {
                  uVar32 = local_178;
                }
                if (uVar34 <= uVar32) {
                  uVar32 = (ulong)uVar34;
                }
                uVar45 = 1;
                do {
                  if (puVar7[uVar45 + (uVar36 - 1)] != puVar7[uVar45 + (uVar36 - local_108) + -2])
                  goto LAB_0045caed;
                  uVar45 = uVar45 + 1;
                } while (uVar32 != uVar45);
                uVar45 = (ulong)uVar38;
              }
LAB_0045caed:
              iVar15 = (int)uVar45;
              if (iVar15 - 3U < 0xfffffffe) {
                uVar34 = (uVar31 - 6) + (uint)(uVar31 < 10) * 3;
                if (uVar31 < 4) {
                  uVar34 = 0;
                }
                uVar27 = (int)local_d8 + 1U & uVar41;
                uVar5 = local_f0[uVar34][uVar27];
                uVar6 = coder->is_rep[uVar34];
                uVar38 = iVar15 + uVar10;
                if ((uint)local_1c0 < uVar38) {
                  puVar17 = local_110 + local_1c0 * 0xb;
                  lVar35 = 0;
                  do {
                    *puVar17 = 0x40000000;
                    lVar35 = lVar35 + -1;
                    puVar17 = puVar17 + 0xb;
                  } while (local_1c0 - (iVar15 + uVar10) != lVar35);
                  local_1c0 = (ulong)((uint)local_1c0 - (int)lVar35);
                }
                uVar26 = uVar26 + lzma_rc_prices[(ulong)(uVar5 >> 4) ^ 0x7f] +
                         (uint)lzma_rc_prices[(ulong)(uVar6 >> 4) ^ 0x7f] +
                         local_e8[uVar27][iVar15 - 3U] +
                         (uint)lzma_rc_prices[coder->is_rep0[uVar34] >> 4] +
                         (uint)lzma_rc_prices[(ulong)(local_c8[uVar34][uVar27] >> 4) ^ 0x7f];
                if (uVar26 < local_130[uVar38].price) {
                  local_130[uVar38].price = uVar26;
                  local_130[uVar38].pos_prev = (uint32_t)local_98;
                  local_130[uVar38].back_prev = 0;
                  local_130[uVar38].prev_1_is_literal = true;
                  local_130[uVar38].prev_2 = false;
                }
              }
            }
            psVar37 = (short *)(puVar7 + (local_b0 - 1));
            sVar18 = *psVar37;
            local_60 = local_c8[uVar13] + uVar43;
            uVar45 = local_178;
            if (local_118 < local_178) {
              uVar45 = local_118;
            }
            if (local_c0 <= uVar45) {
              uVar45 = local_c0;
            }
            local_b0 = uVar43 * 0x440;
            uVar32 = 2;
            local_48 = (long)*local_f0 + (ulong)(((uint)(6 < uVar31) * 3 + 8) * 0x20);
            lVar35 = 0;
            local_b8 = uVar45;
            local_108 = CONCAT62(local_108._2_6_,sVar18);
            uVar13 = local_120;
            plVar39 = local_130;
            do {
              uVar16 = (ulong)local_158[lVar35];
              if (sVar18 == *(short *)(puVar7 + ((uVar36 - 2) - uVar16))) {
                uVar44 = 2;
                if (2 < (uint)local_100) {
                  uVar44 = 2;
                  do {
                    if (*(uint8_t *)((long)psVar37 + uVar44) !=
                        puVar7[uVar44 + (uVar36 - uVar16) + -2]) goto LAB_0045cd5b;
                    uVar44 = uVar44 + 1;
                  } while (uVar45 != uVar44);
                  uVar44 = local_100 & 0xffffffff;
                }
LAB_0045cd5b:
                iVar15 = (int)uVar44;
                uVar26 = iVar15 + uVar10;
                if ((uint)local_1c0 < uVar26) {
                  puVar17 = local_110 + local_1c0 * 0xb;
                  lVar24 = 0;
                  do {
                    *puVar17 = 0x40000000;
                    lVar24 = lVar24 + -1;
                    puVar17 = puVar17 + 0xb;
                  } while (local_1c0 - (uVar10 + iVar15) != lVar24);
                  local_1c0 = (ulong)((uint)local_1c0 - (int)lVar24);
                }
                uVar5 = coder->is_rep0[uVar13] >> 4;
                uVar25 = (uint32_t)lVar35;
                if (lVar35 == 0) {
                  bVar1 = lzma_rc_prices[uVar5];
                  uVar45 = (ulong)(*local_60 >> 4) ^ 0x7f;
LAB_0045ce29:
                  iVar23 = (uint)lzma_rc_prices[uVar45] + (uint)bVar1;
                }
                else {
                  bVar1 = lzma_rc_prices[(ulong)uVar5 ^ 0x7f];
                  uVar5 = coder->is_rep1[uVar13] >> 4;
                  uVar45 = (ulong)uVar5;
                  if (lVar35 == 1) goto LAB_0045ce29;
                  iVar23 = (uint)lzma_rc_prices
                                 [(2 - uVar25 & 0x7f0 ^ (uint)coder->is_rep2[uVar13]) >> 4] +
                           (uint)lzma_rc_prices[(ulong)uVar5 ^ 0x7f] + (uint)bVar1;
                }
                iVar23 = iVar23 + (int)local_e0;
                puVar17 = pauVar8[uVar43] + (iVar15 - 2U);
                uVar45 = uVar44 & 0xffffffff;
                do {
                  uVar31 = *puVar17 + iVar23;
                  uVar34 = (int)uVar45 + uVar10;
                  if (uVar31 < plVar39[uVar34].price) {
                    plVar39[uVar34].price = uVar31;
                    plVar39[uVar34].pos_prev = uVar10;
                    plVar39[uVar34].back_prev = uVar25;
                    plVar39[uVar34].prev_1_is_literal = false;
                  }
                  uVar31 = (int)uVar45 - 1;
                  uVar45 = (ulong)uVar31;
                  puVar17 = puVar17 + -1;
                } while (1 < uVar31);
                uVar31 = iVar15 + 1;
                uVar32 = uVar32 & 0xffffffff;
                if (lVar35 == 0) {
                  uVar32 = (ulong)uVar31;
                }
                uVar38 = iVar15 + (int)local_118 + 1;
                uVar34 = uVar22;
                if (uVar38 < uVar22) {
                  uVar34 = uVar38;
                }
                uVar27 = uVar31;
                if (uVar31 < uVar34) {
                  puVar33 = puVar7 + uVar31 + uVar36;
                  uVar45 = (ulong)uVar38;
                  if (local_178 < uVar38) {
                    uVar45 = local_178;
                  }
                  if (local_c0 <= uVar45) {
                    uVar45 = local_c0;
                  }
                  lVar24 = uVar45 - uVar31;
                  uVar38 = uVar31;
                  do {
                    uVar27 = uVar38;
                    if (puVar33[-1] != puVar33[-2 - uVar16]) break;
                    uVar38 = uVar38 + 1;
                    puVar33 = puVar33 + 1;
                    lVar24 = lVar24 + -1;
                    uVar27 = uVar34;
                  } while (lVar24 != 0);
                }
                if (uVar27 - uVar31 < 2) {
                  uVar13 = local_120;
                  uVar45 = local_b8;
                  plVar39 = local_130;
                  sVar18 = (short)local_108;
                }
                else {
                  uVar34 = (int)local_d8 + iVar15;
                  uVar11 = pauVar8[uVar43][iVar15 - 2U];
                  local_a4 = (uint)lzma_rc_prices
                                   [*(ushort *)(local_48 + (ulong)(uVar34 & uVar41) * 2) >> 4];
                  local_80 = uVar32;
                  local_40 = (ulong)(uVar27 - uVar31);
                  uVar12 = get_literal_price(coder,uVar34,
                                             (uint)*(byte *)((long)psVar37 + (ulong)(iVar15 - 1)),
                                             true,(uint)*(byte *)((long)(puVar7 + ((uVar36 - 2) -
                                                                                  uVar16)) +
                                                                 (uVar44 & 0xffffffff)),
                                             (uint)*(byte *)((long)psVar37 + (uVar44 & 0xffffffff)))
                  ;
                  uVar34 = iVar15 + (int)local_d8 + 1U & uVar41;
                  uVar5 = coder->is_match[5][uVar34];
                  uVar6 = coder->is_rep[5];
                  uVar31 = uVar26 + (int)local_40 + 1;
                  if ((uint)local_1c0 < uVar31) {
                    puVar17 = local_110 + local_1c0 * 0xb;
                    lVar24 = 0;
                    do {
                      *puVar17 = 0x40000000;
                      lVar24 = lVar24 + -1;
                      puVar17 = puVar17 + 0xb;
                    } while (local_1c0 - (uVar27 + uVar10) != lVar24);
                    local_1c0 = (ulong)((uint)local_1c0 - (int)lVar24);
                  }
                  uVar34 = uVar11 + iVar23 + local_a4 + uVar12 +
                           (uint)lzma_rc_prices[(ulong)(uVar5 >> 4) ^ 0x7f] +
                           (uint)lzma_rc_prices[(ulong)(uVar6 >> 4) ^ 0x7f] +
                           local_e8[uVar34][(int)local_40 - 2] +
                           (uint)lzma_rc_prices[coder->is_rep0[5] >> 4] +
                           (uint)lzma_rc_prices[(ulong)(coder->is_rep0_long[5][uVar34] >> 4) ^ 0x7f]
                  ;
                  if (uVar34 < local_130[uVar31].price) {
                    local_130[uVar31].price = uVar34;
                    local_130[uVar31].pos_prev = uVar26 + 1;
                    local_130[uVar31].back_prev = 0;
                    local_130[uVar31].prev_1_is_literal = true;
                    local_130[uVar31].prev_2 = true;
                    local_130[uVar31].pos_prev_2 = uVar10;
                    local_130[uVar31].back_prev_2 = uVar25;
                  }
                  uVar13 = local_120;
                  uVar45 = local_b8;
                  uVar32 = local_80;
                  plVar39 = local_130;
                  sVar18 = (short)local_108;
                }
              }
              lVar35 = lVar35 + 1;
            } while (lVar35 != 4);
            uVar31 = (uint)local_68;
            uVar26 = (uint)local_118;
            uVar34 = local_128;
            uVar38 = uVar31;
            if ((uint)local_100 < uVar31) {
              uVar34 = 0;
              do {
                uVar38 = uVar34;
                uVar34 = uVar38 + 1;
              } while (matches[uVar38].len < (uint)local_100);
              matches[uVar38].len = (uint)local_100;
              uVar38 = (uint)local_100;
            }
            uVar27 = (uint)uVar32;
            if (uVar27 <= uVar38) {
              if ((uint)local_1c0 < uVar38 + uVar10) {
                if (uVar26 <= uVar31) {
                  uVar31 = uVar26;
                }
                if (uVar9 <= uVar31) {
                  uVar31 = uVar9;
                }
                if (local_f8 <= uVar31) {
                  uVar31 = local_f8;
                }
                puVar17 = local_110 + local_1c0 * 0xb;
                lVar35 = 0;
                do {
                  *puVar17 = 0x40000000;
                  lVar35 = lVar35 + -1;
                  puVar17 = puVar17 + 0xb;
                } while (local_1c0 - (uVar31 + uVar10) != lVar35);
                local_1c0 = (ulong)((uint)local_1c0 - (int)lVar35);
              }
              uVar45 = 0xffffffff;
              do {
                uVar45 = (ulong)((int)uVar45 + 1);
              } while (matches[uVar45].len < uVar27);
              local_f4 = local_f4 + (uint)lzma_rc_prices[local_78];
              uVar26 = uVar26 + uVar27;
              local_e0 = (long)*local_f0 + (ulong)(((uint)(6 < (uint)uVar13) * 3 + 7) * 0x20);
              local_128 = uVar34;
              do {
                uVar26 = uVar26 + 1;
                uVar34 = (uint)uVar32;
                uVar31 = uVar26;
                if (uVar22 < uVar26) {
                  uVar31 = uVar22;
                }
                uVar38 = coder->matches[uVar45].dist;
                uVar13 = (ulong)uVar38;
                uVar27 = 3;
                if (uVar34 < 6) {
                  uVar27 = uVar34 - 2;
                }
                if (uVar13 < 0x80) {
                  uVar25 = local_58[uVar27][uVar13];
                }
                else {
                  sVar14 = 0x1e;
                  if (-1 < (int)uVar38) {
                    sVar14 = 0x12;
                  }
                  iVar15 = 0x3c;
                  if (-1 < (int)uVar38) {
                    iVar15 = 0x24;
                  }
                  if (uVar38 < 0x80000) {
                    sVar14 = 6;
                    iVar15 = 0xc;
                  }
                  uVar25 = coder->align_prices[uVar38 & 0xf] +
                           local_50[uVar27][(uint)""[uVar38 >> sVar14] + iVar15];
                }
                uVar27 = uVar25 + local_f4 +
                         *(int *)((long)*local_38 + (ulong)(uVar34 - 2) * 4 + local_b0);
                uVar28 = uVar34 + uVar10;
                if (uVar27 < plVar39[uVar28].price) {
                  plVar39[uVar28].price = uVar27;
                  plVar39[uVar28].pos_prev = uVar10;
                  plVar39[uVar28].back_prev = uVar38 + 4;
                  plVar39[uVar28].prev_1_is_literal = false;
                }
                uVar43 = (ulong)(uVar34 + 1);
                bVar46 = true;
                if (uVar34 == matches[uVar45].len) {
                  lVar35 = (uVar36 - 2) - uVar13;
                  uVar21 = uVar34 + 1;
                  uVar29 = (int)local_118 + uVar34 + 1;
                  if (uVar22 <= uVar29) {
                    uVar29 = uVar22;
                  }
                  uVar42 = uVar21;
                  if (uVar21 < uVar29) {
                    do {
                      if (*(uint8_t *)((long)psVar37 + uVar43) != puVar7[uVar43 + lVar35])
                      goto LAB_0045d3c2;
                      uVar43 = uVar43 + 1;
                    } while (uVar43 < uVar29);
                    uVar43 = (ulong)uVar31;
LAB_0045d3c2:
                    uVar42 = (uint)uVar43;
                  }
                  if (1 < uVar42 - uVar21) {
                    uVar31 = uVar34 + (int)local_d8;
                    uVar29 = uVar31 & uVar41;
                    local_120 = CONCAT44(local_120._4_4_,
                                         (uint)lzma_rc_prices
                                               [*(ushort *)(local_e0 + (ulong)uVar29 * 2) >> 4]);
                    local_100 = (ulong)(uVar42 - uVar21);
                    uVar25 = get_literal_price(coder,uVar31,
                                               (uint)*(byte *)((long)psVar37 + (ulong)(uVar34 - 1)),
                                               true,(uint)puVar7[(uVar32 & 0xffffffff) + lVar35],
                                               (uint)*(byte *)((long)psVar37 + (uVar32 & 0xffffffff)
                                                              ));
                    uVar29 = uVar29 + 1 & uVar41;
                    uVar5 = coder->is_match[4][uVar29];
                    uVar6 = coder->is_rep[4];
                    uVar31 = uVar28 + (int)local_100 + 1;
                    if ((uint)local_1c0 < uVar31) {
                      puVar17 = local_110 + local_1c0 * 0xb;
                      lVar35 = 0;
                      do {
                        *puVar17 = 0x40000000;
                        lVar35 = lVar35 + -1;
                        puVar17 = puVar17 + 0xb;
                      } while (local_1c0 - (uVar42 + uVar10) != lVar35);
                      local_1c0 = (ulong)((uint)local_1c0 - (int)lVar35);
                    }
                    uVar27 = uVar27 + (int)local_120 + uVar25 +
                             (uint)lzma_rc_prices[(ulong)(uVar5 >> 4) ^ 0x7f] +
                             (uint)lzma_rc_prices[(ulong)(uVar6 >> 4) ^ 0x7f] +
                             local_e8[uVar29][(int)local_100 - 2] +
                             (uint)lzma_rc_prices[coder->is_rep0[4] >> 4] +
                             (uint)lzma_rc_prices
                                   [(ulong)(coder->is_rep0_long[4][uVar29] >> 4) ^ 0x7f];
                    plVar39 = local_130;
                    if (uVar27 < local_130[uVar31].price) {
                      local_130[uVar31].price = uVar27;
                      local_130[uVar31].pos_prev = uVar28 + 1;
                      local_130[uVar31].back_prev = 0;
                      local_130[uVar31].prev_1_is_literal = true;
                      local_130[uVar31].prev_2 = true;
                      local_130[uVar31].pos_prev_2 = uVar10;
                      local_130[uVar31].back_prev_2 = uVar38 + 4;
                    }
                  }
                  uVar31 = (int)uVar45 + 1;
                  uVar45 = (ulong)uVar31;
                  bVar46 = uVar31 != local_128;
                }
                uVar32 = (ulong)(uVar34 + 1);
              } while (bVar46);
            }
          }
          lVar35 = local_88 + 1;
          local_178 = (ulong)(uVar9 - 1);
          uVar45 = local_98;
          mf = local_138;
        } while (local_98 < local_1c0);
      }
      uVar22 = coder->opts[uVar45 & 0xffffffff].pos_prev;
      uVar10 = coder->opts[uVar45 & 0xffffffff].back_prev;
      coder->opts_end_index = (uint32_t)uVar45;
      do {
        uVar13 = (ulong)uVar22;
        uVar36 = uVar45 & 0xffffffff;
        if (coder->opts[uVar36].prev_1_is_literal == true) {
          coder->opts[uVar13].back_prev = 0xffffffff;
          coder->opts[uVar13].prev_1_is_literal = false;
          uVar41 = uVar22 - 1;
          coder->opts[uVar13].pos_prev = uVar41;
          if (coder->opts[uVar36].prev_2 == true) {
            coder->opts[uVar41].prev_1_is_literal = false;
            coder->opts[uVar41].pos_prev = coder->opts[uVar36].pos_prev_2;
            coder->opts[uVar41].back_prev = coder->opts[uVar36].back_prev_2;
          }
        }
        uVar41 = coder->opts[uVar13].pos_prev;
        uVar25 = coder->opts[uVar13].back_prev;
        coder->opts[uVar13].back_prev = uVar10;
        coder->opts[uVar13].pos_prev = (uint32_t)uVar45;
        bVar46 = uVar22 != 0;
        uVar45 = uVar13;
        uVar22 = uVar41;
        uVar10 = uVar25;
      } while (bVar46);
      uVar22 = coder->opts[0].pos_prev;
      coder->opts_current_index = uVar22;
      *local_140 = uVar22;
      *back_res = coder->opts[0].back_prev;
    }
  }
  else {
    if (uVar10 == 0) {
      __assert_fail("mf->read_ahead > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                    ,0x36e,
                    "void lzma_lzma_optimum_normal(lzma_coder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                   );
    }
    uVar10 = coder->opts[uVar22].pos_prev;
    uVar25 = coder->opts[uVar22].back_prev;
    coder->opts_current_index = uVar10;
    *len_res = uVar10 - uVar22;
    *back_res = uVar25;
  }
  return;
}

Assistant:

extern void
lzma_lzma_optimum_normal(lzma_coder *LZMA_RESTRICT coder, lzma_mf *LZMA_RESTRICT mf,
		uint32_t *LZMA_RESTRICT back_res, uint32_t *LZMA_RESTRICT len_res,
		uint32_t position)
{
	uint32_t reps[REP_DISTANCES];
	uint32_t len_end;
	uint32_t cur;

	// If we have symbols pending, return the next pending symbol.
	if (coder->opts_end_index != coder->opts_current_index) {
		assert(mf->read_ahead > 0);
		*len_res = coder->opts[coder->opts_current_index].pos_prev
				- coder->opts_current_index;
		*back_res = coder->opts[coder->opts_current_index].back_prev;
		coder->opts_current_index = coder->opts[
				coder->opts_current_index].pos_prev;
		return;
	}

	// Update the price tables. In LZMA SDK <= 4.60 (and possibly later)
	// this was done in both initialization function and in the main loop.
	// In liblzma they were moved into this single place.
	if (mf->read_ahead == 0) {
		if (coder->match_price_count >= (1 << 7))
			fill_distances_prices(coder);

		if (coder->align_price_count >= ALIGN_TABLE_SIZE)
			fill_align_prices(coder);
	}

	// TODO: This needs quite a bit of cleaning still. But splitting
	// the original function into two pieces makes it at least a little
	// more readable, since those two parts don't share many variables.

	len_end = helper1(coder, mf, back_res, len_res, position);
	if (len_end == UINT32_MAX)
		return;


	memcpy(reps, coder->reps, sizeof(reps));

	for (cur = 1; cur < len_end; ++cur) {
		assert(cur < OPTS);

		coder->longest_match_length = mf_find(
				mf, &coder->matches_count, coder->matches);

		if (coder->longest_match_length >= mf->nice_len)
			break;

		len_end = helper2(coder, reps, mf_ptr(mf) - 1, len_end,
				position + cur, cur, mf->nice_len,
				my_min(mf_avail(mf) + 1, OPTS - 1 - cur));
	}

	backward(coder, len_res, back_res, cur);
	return;
}